

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

string * __thiscall
pbrt::LightPathIntegrator::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LightPathIntegrator *this)

{
  unique_ptr<pbrt::PowerLightSampler,_std::default_delete<pbrt::PowerLightSampler>_> *in_R8;
  
  StringPrintf<int_const&,std::unique_ptr<pbrt::PowerLightSampler,std::default_delete<pbrt::PowerLightSampler>>const&>
            (__return_storage_ptr__,(pbrt *)"[ LightPathIntegrator maxDepth: %d lightSampler: %s ]",
             (char *)&this->maxDepth,(int *)&this->lightSampler,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string LightPathIntegrator::ToString() const {
    return StringPrintf("[ LightPathIntegrator maxDepth: %d lightSampler: %s ]", maxDepth,
                        lightSampler);
}